

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

size_t cookie_hash_domain(char *domain,size_t len)

{
  char cVar1;
  ulong local_28;
  size_t h;
  char *end;
  size_t len_local;
  char *domain_local;
  
  local_28 = 0x1505;
  len_local = (size_t)domain;
  while (len_local < domain + len) {
    cVar1 = Curl_raw_toupper(*(char *)len_local);
    local_28 = (long)cVar1 ^ local_28 * 0x21;
    len_local = len_local + 1;
  }
  return local_28 & 0xff;
}

Assistant:

static size_t cookie_hash_domain(const char *domain, const size_t len)
{
  const char *end = domain + len;
  size_t h = 5381;

  while(domain < end) {
    h += h << 5;
    h ^= Curl_raw_toupper(*domain++);
  }

  return (h % COOKIE_HASH_SIZE);
}